

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void fs_print_error(string_view path,string_view fname,error_code *ec)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  bool bVar1;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  string local_70;
  char *local_50;
  char *local_48;
  error_code *local_40;
  size_t local_38;
  error_code *local_30;
  error_code *ec_local;
  string_view fname_local;
  string_view path_local;
  
  fname_local._M_len = (size_t)fname._M_str;
  ec_local = (error_code *)fname._M_len;
  fname_local._M_str = (char *)path._M_len;
  local_30 = ec;
  poVar2 = std::operator<<((ostream *)&std::cerr,"ERROR: Ffilesystem:");
  local_40 = ec_local;
  local_38 = fname_local._M_len;
  __str_00._M_str = (char *)fname_local._M_len;
  __str_00._M_len = (size_t)ec_local;
  pbVar3 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar2,__str_00);
  poVar2 = std::operator<<((ostream *)pbVar3,"(");
  local_50 = fname_local._M_str;
  __str._M_str = path._M_str;
  __str._M_len = (size_t)fname_local._M_str;
  local_48 = path._M_str;
  pbVar3 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar2,__str);
  std::operator<<((ostream *)pbVar3,")  ");
  bVar1 = std::error_code::operator_cast_to_bool(local_30);
  if (bVar1) {
    std::error_code::message_abi_cxx11_(&local_70,local_30);
    std::operator<<((ostream *)&std::cerr,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  fs_emit_error();
  std::ostream::operator<<((ostream *)&std::cerr,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void fs_print_error(std::string_view path, std::string_view fname, const std::error_code& ec)
{
  std::cerr << "ERROR: Ffilesystem:" << fname << "(" << path << ")  ";
  if(ec)
    std::cerr << ec.message();

  fs_emit_error();

  std::cerr << std::endl;
}